

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O0

void __thiscall cmGccDepfileLexerHelper::newDependency(cmGccDepfileLexerHelper *this)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  value_type *entry;
  cmGccDepfileLexerHelper *this_local;
  
  if (this->HelperState != Failed) {
    this->HelperState = Dependency;
    pvVar2 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::back
                       (&this->Content);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pvVar2->paths);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(&pvVar2->paths);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        return;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&pvVar2->paths);
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newDependency()
{
  if (this->HelperState == State::Failed) {
    return;
  }
  this->HelperState = State::Dependency;
  auto& entry = this->Content.back();
  if (entry.paths.empty() || !entry.paths.back().empty()) {
    entry.paths.emplace_back();
  }
}